

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes.cpp
# Opt level: O0

Bounds3f * __thiscall pbrt::Curve::Bounds(Curve *this)

{
  span<const_pbrt::Point3<float>_> cp;
  Point3<float> *in_RSI;
  Bounds3f *in_RDI;
  size_t unaff_retaddr;
  undefined4 in_stack_00000018;
  float in_stack_0000001c;
  Transform *in_stack_00000020;
  Float width [2];
  Bounds3f objBounds;
  span<const_pbrt::Point3<float>_> cpSpan;
  Float local_48;
  Float local_44;
  undefined8 local_40;
  undefined8 local_18;
  Float in_stack_fffffffffffffff0;
  Float in_stack_fffffffffffffff4;
  Point3<float> *pPVar1;
  
  pPVar1 = in_RSI;
  pstd::span<pbrt::Point3<float>const>::span<4ul>
            ((span<const_pbrt::Point3<float>_> *)in_RDI,(Point3<float> (*) [4])in_RSI);
  local_40 = local_18;
  cp.n = unaff_retaddr;
  cp.ptr = pPVar1;
  BoundCubicBezier(cp,in_stack_fffffffffffffff4,in_stack_fffffffffffffff0);
  local_48 = Lerp((in_RSI->super_Tuple3<pbrt::Point3,_float>).z,
                  *(Float *)(*(long *)&in_RSI->super_Tuple3<pbrt::Point3,_float> + 0x34),
                  *(Float *)(*(long *)&in_RSI->super_Tuple3<pbrt::Point3,_float> + 0x38));
  local_44 = Lerp(in_RSI[1].super_Tuple3<pbrt::Point3,_float>.x,
                  *(Float *)(*(long *)&in_RSI->super_Tuple3<pbrt::Point3,_float> + 0x34),
                  *(Float *)(*(long *)&in_RSI->super_Tuple3<pbrt::Point3,_float> + 0x38));
  std::max<float>(&local_48,&local_44);
  Expand<float,float>((Bounds3<float> *)in_stack_00000020,in_stack_0000001c);
  Transform::operator()(in_stack_00000020,(Bounds3f *)CONCAT44(in_stack_0000001c,in_stack_00000018))
  ;
  return in_RDI;
}

Assistant:

PBRT_CPU_GPU Bounds3f Curve::Bounds() const {
    pstd::span<const Point3f> cpSpan(common->cpObj);
    Bounds3f objBounds = BoundCubicBezier(cpSpan, uMin, uMax);
    // Expand _objBounds_ by maximum curve width over $u$ range
    Float width[2] = {Lerp(uMin, common->width[0], common->width[1]),
                      Lerp(uMax, common->width[0], common->width[1])};
    objBounds = Expand(objBounds, std::max(width[0], width[1]) * 0.5f);

    return (*common->renderFromObject)(objBounds);
}